

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_jcc1(DisasContext *s,int b,TCGLabel *l1)

{
  undefined1 local_58 [8];
  CCPrepare cc;
  TCGContext *tcg_ctx;
  TCGLabel *l1_local;
  int b_local;
  DisasContext *s_local;
  
  cc._40_8_ = s->uc->tcg_ctx;
  gen_prepare_cc((CCPrepare *)local_58,s,b,s->T0);
  gen_update_cc_op(s);
  if (cc.imm != 0xffffffffffffffff) {
    tcg_gen_andi_i64_x86_64((TCGContext *)cc._40_8_,s->T0,(TCGv_i64)cc._0_8_,cc.imm);
    cc._0_8_ = s->T0;
  }
  set_cc_op(s,CC_OP_DYNAMIC);
  if (((byte)cc.mask & 1) == 0) {
    tcg_gen_brcondi_i64_x86_64
              ((TCGContext *)cc._40_8_,local_58._0_4_,(TCGv_i64)cc._0_8_,(int64_t)cc.reg2,l1);
  }
  else {
    tcg_gen_brcond_i64_x86_64((TCGContext *)cc._40_8_,local_58._0_4_,(TCGv_i64)cc._0_8_,cc.reg,l1);
  }
  return;
}

Assistant:

static inline void gen_jcc1(DisasContext *s, int b, TCGLabel *l1)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    CCPrepare cc = gen_prepare_cc(s, b, s->T0);

    gen_update_cc_op(s);
    if (cc.mask != -1) {
        tcg_gen_andi_tl(tcg_ctx, s->T0, cc.reg, cc.mask);
        cc.reg = s->T0;
    }
    set_cc_op(s, CC_OP_DYNAMIC);
    if (cc.use_reg2) {
        tcg_gen_brcond_tl(tcg_ctx, cc.cond, cc.reg, cc.reg2, l1);
    } else {
        tcg_gen_brcondi_tl(tcg_ctx, cc.cond, cc.reg, cc.imm, l1);
    }
}